

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O1

bool tinyobj::exportGroupsToShape
               (shape_t *shape,PrimGroup *prim_group,
               vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *tags,int material_id,
               string *name,bool triangulate,vector<float,_std::allocator<float>_> *v)

{
  pointer *ppiVar1;
  pointer *ppuVar2;
  pointer pfVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined8 uVar7;
  undefined4 uVar11;
  pointer pfVar12;
  pointer pfVar13;
  undefined4 uVar20;
  iterator iVar14;
  iterator iVar15;
  iterator iVar16;
  iterator iVar17;
  pointer p_Var18;
  pointer p_Var19;
  undefined1 auVar21 [16];
  bool bVar22;
  int iVar23;
  pointer pfVar24;
  ulong uVar25;
  ulong uVar26;
  pointer pvVar27;
  ulong uVar28;
  int iVar29;
  long lVar30;
  PrimGroup *pPVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  vector<int,_std::allocator<int>_> *__x;
  bool bVar36;
  ulong uVar37;
  pointer pvVar38;
  undefined7 in_register_00000089;
  index_t *piVar39;
  size_t k;
  ulong uVar40;
  long lVar41;
  long lVar42;
  vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *this;
  long lVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  vertex_index_t ind [3];
  real_t vx [3];
  real_t vy [3];
  face_t remainingFace;
  uchar local_11d;
  int local_11c;
  PrimGroup *local_118;
  vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *local_110;
  pointer local_108;
  index_t local_fc;
  index_t local_f0;
  index_t local_e4;
  index_t local_d8;
  int iStack_cc;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int iStack_b8;
  vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *local_b0;
  vector<int,_std::allocator<int>_> *local_a8;
  float local_9c [3];
  vector<unsigned_int,std::allocator<unsigned_int>> *local_90;
  vector<int,std::allocator<int>> *local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_80;
  ulong local_78;
  uint local_6c;
  undefined4 local_68;
  float local_64 [3];
  undefined8 local_58;
  vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_> local_50;
  vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *local_38;
  
  uVar28 = CONCAT71(in_register_00000089,triangulate) & 0xffffffff;
  if (((prim_group->faceGroup).super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (prim_group->faceGroup).super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((prim_group->lineGroup).
      super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (prim_group->lineGroup).
      super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    p_Var19 = (prim_group->pointsGroup).
              super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_68 = (undefined4)
               CONCAT71((int7)((ulong)p_Var19 >> 8),
                        p_Var19 ==
                        (prim_group->pointsGroup).
                        super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
  }
  else {
    local_68 = 0;
  }
  if ((char)local_68 == '\0') {
    local_11c = material_id;
    local_118 = prim_group;
    std::__cxx11::string::_M_assign((string *)shape);
    if ((local_118->faceGroup).super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (local_118->faceGroup).super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pfVar24 = (local_118->faceGroup).
                super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_38 = tags;
      if ((local_118->faceGroup).
          super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
          super__Vector_impl_data._M_finish != pfVar24) {
        this = (vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)&shape->mesh;
        local_80 = &(shape->mesh).num_face_vertices;
        local_88 = (vector<int,std::allocator<int>> *)&(shape->mesh).material_ids;
        local_90 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                   &(shape->mesh).smoothing_group_ids;
        uVar37 = 0;
        local_6c = (uint)CONCAT71(in_register_00000089,triangulate);
        pPVar31 = local_118;
        local_b0 = this;
        do {
          pvVar27 = pfVar24[uVar37].vertex_indices.
                    super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar32 = (long)pfVar24[uVar37].vertex_indices.
                         super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar27 >> 2;
          uVar33 = lVar32 * -0x5555555555555555;
          if (2 < uVar33) {
            pfVar3 = pfVar24 + uVar37;
            __x = (vector<int,_std::allocator<int>_> *)&pfVar24[uVar37].vertex_indices;
            local_108 = pfVar3;
            local_a8 = __x;
            local_78 = uVar37;
            if ((char)uVar28 == '\0') {
              lVar32 = 4;
              uVar37 = uVar33;
              do {
                pvVar27 = (((_Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                             *)&__x->super__Vector_base<int,_std::allocator<int>_>)->_M_impl).
                          super__Vector_impl_data._M_start;
                local_d8.vertex_index = *(int *)((long)pvVar27 + lVar32 + -4);
                uVar7 = *(undefined8 *)((long)&pvVar27->v_idx + lVar32);
                local_d8.texcoord_index = (int)uVar7;
                local_d8.normal_index = (int)((ulong)uVar7 >> 0x20);
                iVar14._M_current =
                     (shape->mesh).indices.
                     super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl
                     .super__Vector_impl_data._M_finish;
                if (iVar14._M_current ==
                    (shape->mesh).indices.
                    super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                  _M_realloc_insert<tinyobj::index_t_const&>(this,iVar14,&local_d8);
                  pPVar31 = local_118;
                  __x = local_a8;
                }
                else {
                  (iVar14._M_current)->texcoord_index = local_d8.texcoord_index;
                  (iVar14._M_current)->vertex_index = local_d8.vertex_index;
                  (iVar14._M_current)->normal_index = local_d8.normal_index;
                  ppiVar1 = &(shape->mesh).indices.
                             super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppiVar1 = *ppiVar1 + 1;
                }
                lVar32 = lVar32 + 0xc;
                uVar37 = uVar37 - 1;
              } while (uVar37 != 0);
              local_d8.vertex_index = CONCAT31(local_d8.vertex_index._1_3_,(uchar)uVar33);
              iVar15._M_current =
                   (shape->mesh).num_face_vertices.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar15._M_current ==
                  (shape->mesh).num_face_vertices.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                _M_realloc_insert<unsigned_char>(local_80,iVar15,(uchar *)&local_d8);
                pPVar31 = local_118;
              }
              else {
                *iVar15._M_current = (uchar)uVar33;
                ppuVar2 = &(shape->mesh).num_face_vertices.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish;
                *ppuVar2 = *ppuVar2 + 1;
              }
              uVar37 = local_78;
              pfVar24 = local_108;
              iVar16._M_current =
                   (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar16._M_current ==
                  (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (local_88,iVar16,&local_11c);
                pPVar31 = local_118;
              }
              else {
                *iVar16._M_current = local_11c;
                (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar16._M_current + 1;
              }
              iVar17._M_current =
                   (shape->mesh).smoothing_group_ids.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar17._M_current ==
                  (shape->mesh).smoothing_group_ids.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>(local_90,iVar17,&pfVar24->smoothing_group_id)
                ;
                pPVar31 = local_118;
              }
              else {
                *iVar17._M_current = pfVar24->smoothing_group_id;
                (shape->mesh).smoothing_group_ids.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar17._M_current + 1;
              }
            }
            else {
              pfVar12 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              uVar37 = (long)(v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pfVar12 >> 2;
              lVar42 = 2;
              lVar41 = 1;
              pvVar38 = pvVar27;
              uVar28 = 1;
              do {
                lVar43 = (long)pvVar38->v_idx;
                iVar23 = 7;
                if (lVar43 * 3 + 2U < uVar37) {
                  uVar34 = lVar32 * 0x5555555555555555 + uVar28;
                  if (uVar34 != 0) {
                    uVar34 = uVar28;
                  }
                  lVar35 = (long)pvVar27[uVar34].v_idx;
                  if (lVar35 * 3 + 2U < uVar37) {
                    lVar30 = (long)pvVar27[(uVar28 + 1) % uVar33].v_idx;
                    if (lVar30 * 3 + 2U < uVar37) {
                      fVar45 = pfVar12[lVar35 * 3] - pfVar12[lVar43 * 3];
                      fVar47 = (float)*(undefined8 *)(pfVar12 + lVar35 * 3 + 1);
                      fVar44 = pfVar12[lVar30 * 3 + 1] - fVar47;
                      fVar49 = (float)((ulong)*(undefined8 *)(pfVar12 + lVar35 * 3 + 1) >> 0x20);
                      fVar47 = fVar47 - (float)*(undefined8 *)(pfVar12 + lVar43 * 3 + 1);
                      fVar48 = fVar49 - (float)((ulong)*(undefined8 *)(pfVar12 + lVar43 * 3 + 1) >>
                                               0x20);
                      fVar49 = pfVar12[lVar30 * 3 + 2] - fVar49;
                      fVar50 = pfVar12[lVar30 * 3] - pfVar12[lVar35 * 3];
                      fVar46 = ABS(fVar47 * fVar49 - fVar44 * fVar48);
                      fVar49 = ABS(fVar48 * fVar50 - fVar49 * fVar45);
                      fVar44 = ABS(fVar44 * fVar45 - fVar50 * fVar47);
                      if ((((1.1920929e-07 < fVar44) || (1.1920929e-07 < fVar46)) ||
                          (iVar23 = 0, 1.1920929e-07 < fVar49)) &&
                         ((iVar23 = 5, fVar46 <= fVar44 || (fVar46 <= fVar49)))) {
                        auVar21._4_4_ = -(uint)(fVar46 < fVar44);
                        auVar21._0_4_ = -(uint)(fVar46 < fVar44);
                        auVar21._8_4_ = -(uint)(fVar49 < fVar44);
                        auVar21._12_4_ = -(uint)(fVar49 < fVar44);
                        iVar29 = movmskpd(pvVar27[(uVar28 + 1) % uVar33].v_idx * 3,auVar21);
                        if (iVar29 == 3) {
                          lVar42 = 1;
                        }
                        lVar41 = 0;
                      }
                    }
                  }
                }
              } while (((iVar23 == 7) || (iVar23 == 0)) &&
                      (lVar43 = lVar32 * 0x5555555555555555 + uVar28, pvVar38 = pvVar38 + 1,
                      uVar28 = uVar28 + 1, lVar43 != 0));
              pfVar13 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              uVar28 = (long)(v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pfVar13 >> 2;
              local_110 = (vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)
                          ((ulong)pfVar12 & 0xffffffff00000000);
              lVar43 = 1;
              pvVar38 = pvVar27;
              do {
                lVar35 = 0;
                if (uVar33 - lVar43 != 0) {
                  lVar35 = lVar43;
                }
                lVar30 = (long)pvVar38->v_idx * 3;
                uVar37 = lVar30 + lVar41;
                if ((uVar37 < uVar28) && (uVar34 = lVar30 + lVar42, uVar34 < uVar28)) {
                  lVar35 = (long)pvVar27[lVar35].v_idx * 3;
                  uVar25 = lVar35 + lVar41;
                  if ((uVar25 < uVar28) && (uVar40 = lVar35 + lVar42, uVar40 < uVar28)) {
                    local_110 = (vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)
                                CONCAT44(local_110._4_4_,
                                         local_110._0_4_ +
                                         (pfVar13[uVar37] * pfVar13[uVar40] -
                                         pfVar13[uVar25] * pfVar13[uVar34]) * 0.5);
                  }
                }
                lVar35 = (lVar32 * 0x5555555555555555 - (ulong)(uVar33 == 0)) + lVar43;
                lVar43 = lVar43 + 1;
                pvVar38 = pvVar38 + 1;
              } while (lVar35 != 0);
              local_58._0_4_ = pfVar3->smoothing_group_id;
              local_58._4_4_ = pfVar3->pad_;
              std::vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::vector
                        (&local_50,
                         (vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                          *)__x);
              local_c8 = -1;
              iStack_c4 = -1;
              iStack_c0 = -1;
              iStack_bc = -1;
              local_d8.vertex_index = -1;
              local_d8.normal_index = -1;
              local_d8.texcoord_index = -1;
              iStack_cc = -1;
              iStack_b8 = -1;
              lVar32 = (long)local_50.
                             super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_50.
                             super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                             ._M_impl.super__Vector_impl_data._M_start;
              uVar28 = (lVar32 >> 2) * -0x5555555555555555;
              if ((3 < uVar28) &&
                 (lVar43 = (long)(pfVar3->vertex_indices).
                                 super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pfVar3->vertex_indices).
                                 super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                 ._M_impl.super__Vector_impl_data._M_start, lVar43 != 0)) {
                uVar37 = (lVar43 >> 2) * -0x5555555555555555;
                uVar34 = 0;
                uVar33 = ((long)local_50.
                                super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_50.
                                super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 2) *
                         -0x5555555555555555;
                do {
                  uVar25 = uVar28;
                  pvVar27 = local_50.
                            super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  uVar28 = uVar25;
                  if (uVar34 < uVar25) {
                    uVar28 = 0;
                  }
                  uVar34 = uVar34 - uVar28;
                  pfVar12 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                            super__Vector_impl_data._M_start;
                  uVar28 = (long)(v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pfVar12 >> 2;
                  piVar39 = &local_d8;
                  lVar32 = 0;
                  do {
                    uVar40 = (uVar34 + lVar32) % uVar25;
                    piVar39->texcoord_index = pvVar27[uVar40].vn_idx;
                    uVar11 = pvVar27[uVar40].v_idx;
                    uVar20 = pvVar27[uVar40].vt_idx;
                    piVar39->vertex_index = uVar11;
                    piVar39->normal_index = uVar20;
                    uVar40 = (long)(int)uVar11 * 3 + lVar41;
                    if ((uVar40 < uVar28) &&
                       (uVar26 = (long)(int)uVar11 * 3 + lVar42, uVar26 < uVar28)) {
                      local_9c[lVar32] = pfVar12[uVar40];
                      fVar44 = pfVar12[uVar26];
                    }
                    else {
                      local_9c[lVar32] = 0.0;
                      fVar44 = 0.0;
                    }
                    local_64[lVar32] = fVar44;
                    lVar32 = lVar32 + 1;
                    piVar39 = piVar39 + 1;
                  } while (lVar32 != 3);
                  uVar37 = uVar37 - 1;
                  if (uVar33 != uVar25) {
                    uVar37 = uVar25;
                  }
                  if (0.0 <= ((local_64[2] - local_64[1]) * (local_9c[1] - local_9c[0]) -
                             (local_9c[2] - local_9c[1]) * (local_64[1] - local_64[0])) *
                             local_110._0_4_) {
                    if (3 < uVar25) {
                      pfVar12 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                super__Vector_impl_data._M_start;
                      uVar28 = (long)(v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                     super__Vector_impl_data._M_finish - (long)pfVar12 >> 2;
                      uVar33 = 3;
                      bVar36 = false;
                      do {
                        lVar32 = (long)pvVar27[(uVar33 + uVar34) % uVar25].v_idx * 3;
                        uVar40 = lVar32 + lVar41;
                        iVar23 = 0x12;
                        if ((uVar40 < uVar28) && (uVar26 = lVar32 + lVar42, uVar26 < uVar28)) {
                          fVar44 = pfVar12[uVar26];
                          bVar22 = false;
                          lVar32 = 2;
                          lVar43 = 0;
                          do {
                            fVar45 = local_64[lVar43];
                            if ((fVar44 < fVar45 == local_64[lVar32] <= fVar44) &&
                               (pfVar12[uVar40] <
                                ((fVar44 - fVar45) * (local_9c[lVar32] - local_9c[lVar43])) /
                                (local_64[lVar32] - fVar45) + local_9c[lVar43])) {
                              bVar22 = !bVar22;
                            }
                            lVar35 = lVar43 + 1;
                            lVar32 = lVar43;
                            lVar43 = lVar35;
                          } while (lVar35 != 3);
                          if (bVar22) {
                            bVar36 = true;
                          }
                          iVar23 = (uint)bVar22 << 4;
                        }
                      } while (((iVar23 == 0x12) || (iVar23 == 0)) &&
                              (uVar33 = uVar33 + 1, uVar33 != uVar25));
                      if (bVar36) goto LAB_00151e14;
                    }
                    local_e4.vertex_index = local_d8.vertex_index;
                    local_e4.normal_index = local_d8.texcoord_index;
                    local_e4.texcoord_index = local_d8.normal_index;
                    local_f0.vertex_index = iStack_cc;
                    local_f0.normal_index = iStack_c4;
                    local_f0.texcoord_index = local_c8;
                    local_fc.vertex_index = iStack_c0;
                    local_fc.normal_index = iStack_b8;
                    local_fc.texcoord_index = iStack_bc;
                    iVar14._M_current =
                         (shape->mesh).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                    if (iVar14._M_current ==
                        (shape->mesh).indices.
                        super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                      _M_realloc_insert<tinyobj::index_t_const&>(local_b0,iVar14,&local_e4);
                    }
                    else {
                      (iVar14._M_current)->texcoord_index = local_d8.normal_index;
                      (iVar14._M_current)->vertex_index = local_d8.vertex_index;
                      (iVar14._M_current)->normal_index = local_d8.texcoord_index;
                      ppiVar1 = &(shape->mesh).indices.
                                 super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                      *ppiVar1 = *ppiVar1 + 1;
                    }
                    iVar14._M_current =
                         (shape->mesh).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                    if (iVar14._M_current ==
                        (shape->mesh).indices.
                        super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                      _M_realloc_insert<tinyobj::index_t_const&>(local_b0,iVar14,&local_f0);
                    }
                    else {
                      (iVar14._M_current)->texcoord_index = local_f0.texcoord_index;
                      (iVar14._M_current)->vertex_index = local_f0.vertex_index;
                      (iVar14._M_current)->normal_index = local_f0.normal_index;
                      ppiVar1 = &(shape->mesh).indices.
                                 super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                      *ppiVar1 = *ppiVar1 + 1;
                    }
                    iVar14._M_current =
                         (shape->mesh).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                    if (iVar14._M_current ==
                        (shape->mesh).indices.
                        super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                      _M_realloc_insert<tinyobj::index_t_const&>(local_b0,iVar14,&local_fc);
                    }
                    else {
                      (iVar14._M_current)->texcoord_index = local_fc.texcoord_index;
                      (iVar14._M_current)->vertex_index = local_fc.vertex_index;
                      (iVar14._M_current)->normal_index = local_fc.normal_index;
                      ppiVar1 = &(shape->mesh).indices.
                                 super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                      *ppiVar1 = *ppiVar1 + 1;
                    }
                    local_11d = '\x03';
                    iVar15._M_current =
                         (shape->mesh).num_face_vertices.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (iVar15._M_current ==
                        (shape->mesh).num_face_vertices.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                      _M_realloc_insert<unsigned_char>(local_80,iVar15,&local_11d);
                    }
                    else {
                      *iVar15._M_current = '\x03';
                      ppuVar2 = &(shape->mesh).num_face_vertices.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish;
                      *ppuVar2 = *ppuVar2 + 1;
                    }
                    iVar16._M_current =
                         (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                    if (iVar16._M_current ==
                        (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                (local_88,iVar16,&local_11c);
                    }
                    else {
                      *iVar16._M_current = local_11c;
                      (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_finish = iVar16._M_current + 1;
                    }
                    iVar17._M_current =
                         (shape->mesh).smoothing_group_ids.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (iVar17._M_current ==
                        (shape->mesh).smoothing_group_ids.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<unsigned_int,std::allocator<unsigned_int>>::
                      _M_realloc_insert<unsigned_int_const&>
                                (local_90,iVar17,&local_108->smoothing_group_id);
                    }
                    else {
                      *iVar17._M_current = local_108->smoothing_group_id;
                      (shape->mesh).smoothing_group_ids.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish = iVar17._M_current + 1;
                    }
                    uVar28 = (uVar34 + 1) % uVar25;
                    while (uVar33 = uVar28 + 1, uVar33 < uVar25) {
                      local_50.
                      super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar28].vn_idx =
                           local_50.
                           super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar33].vn_idx;
                      iVar23 = local_50.
                               super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar33].vt_idx;
                      local_50.
                      super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar28].v_idx =
                           local_50.
                           super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar33].v_idx;
                      local_50.
                      super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar28].vt_idx = iVar23;
                      uVar28 = uVar33;
                    }
                    local_50.
                    super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
                         local_50.
                         super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -1;
                  }
                  else {
LAB_00151e14:
                    uVar34 = uVar34 + 1;
                  }
                  lVar32 = (long)local_50.
                                 super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_50.
                                 super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                  uVar28 = (lVar32 >> 2) * -0x5555555555555555;
                } while ((3 < uVar28) && (uVar33 = uVar25, uVar37 != 0));
              }
              uVar37 = local_78;
              this = local_b0;
              uVar28 = (ulong)local_6c;
              if (lVar32 == 0x24) {
                local_e4.vertex_index =
                     (local_50.
                      super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                      ._M_impl.super__Vector_impl_data._M_start)->v_idx;
                local_f0.vertex_index =
                     local_50.
                     super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].v_idx;
                local_fc.vertex_index =
                     local_50.
                     super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                     ._M_impl.super__Vector_impl_data._M_start[2].v_idx;
                uVar4 = (local_50.
                         super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                         ._M_impl.super__Vector_impl_data._M_start)->vt_idx;
                uVar8 = (local_50.
                         super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                         ._M_impl.super__Vector_impl_data._M_start)->vn_idx;
                uVar5 = local_50.
                        super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].vt_idx;
                uVar9 = local_50.
                        super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].vn_idx;
                uVar6 = local_50.
                        super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                        ._M_impl.super__Vector_impl_data._M_start[2].vt_idx;
                uVar10 = local_50.
                         super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                         ._M_impl.super__Vector_impl_data._M_start[2].vn_idx;
                iVar14._M_current =
                     (shape->mesh).indices.
                     super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl
                     .super__Vector_impl_data._M_finish;
                local_fc.normal_index = uVar10;
                local_fc.texcoord_index = uVar6;
                local_f0.normal_index = uVar9;
                local_f0.texcoord_index = uVar5;
                local_e4.normal_index = uVar8;
                local_e4.texcoord_index = uVar4;
                if (iVar14._M_current ==
                    (shape->mesh).indices.
                    super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                  _M_realloc_insert<tinyobj::index_t_const&>(local_b0,iVar14,&local_e4);
                }
                else {
                  (iVar14._M_current)->texcoord_index = uVar4;
                  (iVar14._M_current)->vertex_index = local_e4.vertex_index;
                  (iVar14._M_current)->normal_index = uVar8;
                  ppiVar1 = &(shape->mesh).indices.
                             super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppiVar1 = *ppiVar1 + 1;
                }
                pfVar24 = local_108;
                iVar14._M_current =
                     (shape->mesh).indices.
                     super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl
                     .super__Vector_impl_data._M_finish;
                if (iVar14._M_current ==
                    (shape->mesh).indices.
                    super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                  _M_realloc_insert<tinyobj::index_t_const&>(this,iVar14,&local_f0);
                }
                else {
                  (iVar14._M_current)->texcoord_index = local_f0.texcoord_index;
                  (iVar14._M_current)->vertex_index = local_f0.vertex_index;
                  (iVar14._M_current)->normal_index = local_f0.normal_index;
                  ppiVar1 = &(shape->mesh).indices.
                             super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppiVar1 = *ppiVar1 + 1;
                }
                iVar14._M_current =
                     (shape->mesh).indices.
                     super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl
                     .super__Vector_impl_data._M_finish;
                if (iVar14._M_current ==
                    (shape->mesh).indices.
                    super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                  _M_realloc_insert<tinyobj::index_t_const&>(this,iVar14,&local_fc);
                }
                else {
                  (iVar14._M_current)->texcoord_index = local_fc.texcoord_index;
                  (iVar14._M_current)->vertex_index = local_fc.vertex_index;
                  (iVar14._M_current)->normal_index = local_fc.normal_index;
                  ppiVar1 = &(shape->mesh).indices.
                             super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppiVar1 = *ppiVar1 + 1;
                }
                local_11d = '\x03';
                iVar15._M_current =
                     (shape->mesh).num_face_vertices.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar15._M_current ==
                    (shape->mesh).num_face_vertices.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                  _M_realloc_insert<unsigned_char>(local_80,iVar15,&local_11d);
                }
                else {
                  *iVar15._M_current = '\x03';
                  ppuVar2 = &(shape->mesh).num_face_vertices.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
                  *ppuVar2 = *ppuVar2 + 1;
                }
                iVar16._M_current =
                     (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                if (iVar16._M_current ==
                    (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (local_88,iVar16,&local_11c);
                }
                else {
                  *iVar16._M_current = local_11c;
                  (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar16._M_current + 1;
                }
                iVar17._M_current =
                     (shape->mesh).smoothing_group_ids.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar17._M_current ==
                    (shape->mesh).smoothing_group_ids.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            (local_90,iVar17,&pfVar24->smoothing_group_id);
                }
                else {
                  *iVar17._M_current = pfVar24->smoothing_group_id;
                  (shape->mesh).smoothing_group_ids.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar17._M_current + 1;
                }
              }
              pPVar31 = local_118;
              if (local_50.
                  super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_50.
                                super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                ._M_impl.super__Vector_impl_data._M_start);
                pPVar31 = local_118;
              }
            }
          }
          uVar37 = uVar37 + 1;
          pfVar24 = (pPVar31->faceGroup).
                    super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar37 < (ulong)((long)(pPVar31->faceGroup).
                                        super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar24
                                 >> 5));
      }
      std::vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>::operator=
                (&(shape->mesh).tags,local_38);
    }
    pPVar31 = local_118;
    if (((local_118->lineGroup).
         super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
         super__Vector_impl_data._M_start !=
         (local_118->lineGroup).
         super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       ((local_118->lineGroup).
        super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (local_118->lineGroup).
        super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
        super__Vector_impl_data._M_start)) {
      local_110 = (vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)&shape->lines;
      local_a8 = &(shape->lines).num_line_vertices;
      uVar28 = 0;
      do {
        p_Var18 = (pPVar31->lineGroup).
                  super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pvVar27 = *(pointer *)
                   &p_Var18[uVar28].vertex_indices.
                    super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                    ._M_impl;
        if (*(pointer *)
             ((long)&p_Var18[uVar28].vertex_indices.
                     super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                     ._M_impl + 8) == pvVar27) {
          uVar37 = 0;
        }
        else {
          lVar32 = 4;
          uVar33 = 0;
          do {
            local_d8.vertex_index = *(int *)((long)pvVar27 + lVar32 + -4);
            uVar7 = *(undefined8 *)((long)&pvVar27->v_idx + lVar32);
            local_d8.texcoord_index = (int)uVar7;
            local_d8.normal_index = (int)((ulong)uVar7 >> 0x20);
            iVar14._M_current =
                 (shape->lines).indices.
                 super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar14._M_current ==
                (shape->lines).indices.
                super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
              _M_realloc_insert<tinyobj::index_t_const&>(local_110,iVar14,&local_d8);
              pPVar31 = local_118;
            }
            else {
              (iVar14._M_current)->texcoord_index = local_d8.texcoord_index;
              (iVar14._M_current)->vertex_index = local_d8.vertex_index;
              (iVar14._M_current)->normal_index = local_d8.normal_index;
              ppiVar1 = &(shape->lines).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              *ppiVar1 = *ppiVar1 + 1;
            }
            uVar33 = uVar33 + 1;
            p_Var18 = (pPVar31->lineGroup).
                      super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pvVar27 = *(pointer *)
                       &p_Var18[uVar28].vertex_indices.
                        super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                        ._M_impl;
            uVar37 = ((long)*(pointer *)
                             ((long)&p_Var18[uVar28].vertex_indices.
                                     super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                     ._M_impl + 8) - (long)pvVar27 >> 2) * -0x5555555555555555;
            lVar32 = lVar32 + 0xc;
          } while (uVar33 < uVar37);
        }
        local_d8.vertex_index = (int)uVar37;
        iVar16._M_current =
             (shape->lines).num_line_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar16._M_current ==
            (shape->lines).num_line_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (local_a8,iVar16,&local_d8.vertex_index);
          pPVar31 = local_118;
        }
        else {
          *iVar16._M_current = local_d8.vertex_index;
          (shape->lines).num_line_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar16._M_current + 1;
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 < (ulong)(((long)(pPVar31->lineGroup).
                                       super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pPVar31->lineGroup).
                                       super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x5555555555555555));
    }
    if (((pPVar31->pointsGroup).
         super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>._M_impl.
         super__Vector_impl_data._M_start !=
         (pPVar31->pointsGroup).
         super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       ((pPVar31->pointsGroup).
        super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (pPVar31->pointsGroup).
        super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>._M_impl.
        super__Vector_impl_data._M_start)) {
      local_110 = (vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)&shape->points;
      uVar28 = 0;
      do {
        p_Var19 = (pPVar31->pointsGroup).
                  super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pvVar27 = *(pointer *)
                   &p_Var19[uVar28].vertex_indices.
                    super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                    ._M_impl;
        if (*(pointer *)
             ((long)&p_Var19[uVar28].vertex_indices.
                     super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                     ._M_impl + 8) != pvVar27) {
          lVar32 = 4;
          uVar37 = 0;
          do {
            local_d8.vertex_index = *(int *)((long)pvVar27 + lVar32 + -4);
            uVar7 = *(undefined8 *)((long)&pvVar27->v_idx + lVar32);
            local_d8.texcoord_index = (int)uVar7;
            local_d8.normal_index = (int)((ulong)uVar7 >> 0x20);
            iVar14._M_current =
                 (shape->points).indices.
                 super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar14._M_current ==
                (shape->points).indices.
                super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
              _M_realloc_insert<tinyobj::index_t_const&>(local_110,iVar14,&local_d8);
              pPVar31 = local_118;
            }
            else {
              (iVar14._M_current)->texcoord_index = local_d8.texcoord_index;
              (iVar14._M_current)->vertex_index = local_d8.vertex_index;
              (iVar14._M_current)->normal_index = local_d8.normal_index;
              ppiVar1 = &(shape->points).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              *ppiVar1 = *ppiVar1 + 1;
            }
            uVar37 = uVar37 + 1;
            p_Var19 = (pPVar31->pointsGroup).
                      super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pvVar27 = *(pointer *)
                       &p_Var19[uVar28].vertex_indices.
                        super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                        ._M_impl;
            lVar32 = lVar32 + 0xc;
          } while (uVar37 < (ulong)(((long)*(pointer *)
                                            ((long)&p_Var19[uVar28].vertex_indices.
                                                                                                        
                                                  super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                                  ._M_impl + 8) - (long)pvVar27 >> 2) *
                                   -0x5555555555555555));
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 < (ulong)(((long)(pPVar31->pointsGroup).
                                       super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pPVar31->pointsGroup).
                                       super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x5555555555555555));
    }
  }
  return (bool)((byte)local_68 ^ 1);
}

Assistant:

static bool exportGroupsToShape(shape_t *shape, const PrimGroup &prim_group,
                                const std::vector<tag_t> &tags,
                                const int material_id, const std::string &name,
                                bool triangulate,
                                const std::vector<real_t> &v) {
  if (prim_group.IsEmpty()) {
    return false;
  }

  shape->name = name;

  // polygon
  if (!prim_group.faceGroup.empty()) {
    // Flatten vertices and indices
    for (size_t i = 0; i < prim_group.faceGroup.size(); i++) {
      const face_t &face = prim_group.faceGroup[i];

      size_t npolys = face.vertex_indices.size();

      if (npolys < 3) {
        // Face must have 3+ vertices.
        continue;
      }

      vertex_index_t i0 = face.vertex_indices[0];
      vertex_index_t i1(-1);
      vertex_index_t i2 = face.vertex_indices[1];

      if (triangulate) {
        // find the two axes to work in
        size_t axes[2] = {1, 2};
        for (size_t k = 0; k < npolys; ++k) {
          i0 = face.vertex_indices[(k + 0) % npolys];
          i1 = face.vertex_indices[(k + 1) % npolys];
          i2 = face.vertex_indices[(k + 2) % npolys];
          size_t vi0 = size_t(i0.v_idx);
          size_t vi1 = size_t(i1.v_idx);
          size_t vi2 = size_t(i2.v_idx);

          if (((3 * vi0 + 2) >= v.size()) || ((3 * vi1 + 2) >= v.size()) ||
              ((3 * vi2 + 2) >= v.size())) {
            // Invalid triangle.
            // FIXME(syoyo): Is it ok to simply skip this invalid triangle?
            continue;
          }
          real_t v0x = v[vi0 * 3 + 0];
          real_t v0y = v[vi0 * 3 + 1];
          real_t v0z = v[vi0 * 3 + 2];
          real_t v1x = v[vi1 * 3 + 0];
          real_t v1y = v[vi1 * 3 + 1];
          real_t v1z = v[vi1 * 3 + 2];
          real_t v2x = v[vi2 * 3 + 0];
          real_t v2y = v[vi2 * 3 + 1];
          real_t v2z = v[vi2 * 3 + 2];
          real_t e0x = v1x - v0x;
          real_t e0y = v1y - v0y;
          real_t e0z = v1z - v0z;
          real_t e1x = v2x - v1x;
          real_t e1y = v2y - v1y;
          real_t e1z = v2z - v1z;
          real_t cx = std::fabs(e0y * e1z - e0z * e1y);
          real_t cy = std::fabs(e0z * e1x - e0x * e1z);
          real_t cz = std::fabs(e0x * e1y - e0y * e1x);
          const real_t epsilon = std::numeric_limits<real_t>::epsilon();
          if (cx > epsilon || cy > epsilon || cz > epsilon) {
            // found a corner
            if (cx > cy && cx > cz) {
            } else {
              axes[0] = 0;
              if (cz > cx && cz > cy) axes[1] = 1;
            }
            break;
          }
        }

        real_t area = 0;
        for (size_t k = 0; k < npolys; ++k) {
          i0 = face.vertex_indices[(k + 0) % npolys];
          i1 = face.vertex_indices[(k + 1) % npolys];
          size_t vi0 = size_t(i0.v_idx);
          size_t vi1 = size_t(i1.v_idx);
          if (((vi0 * 3 + axes[0]) >= v.size()) ||
              ((vi0 * 3 + axes[1]) >= v.size()) ||
              ((vi1 * 3 + axes[0]) >= v.size()) ||
              ((vi1 * 3 + axes[1]) >= v.size())) {
            // Invalid index.
            continue;
          }
          real_t v0x = v[vi0 * 3 + axes[0]];
          real_t v0y = v[vi0 * 3 + axes[1]];
          real_t v1x = v[vi1 * 3 + axes[0]];
          real_t v1y = v[vi1 * 3 + axes[1]];
          area += (v0x * v1y - v0y * v1x) * static_cast<real_t>(0.5);
        }

        face_t remainingFace = face;  // copy
        size_t guess_vert = 0;
        vertex_index_t ind[3];
        real_t vx[3];
        real_t vy[3];

        // How many iterations can we do without decreasing the remaining
        // vertices.
        size_t remainingIterations = face.vertex_indices.size();
        size_t previousRemainingVertices = remainingFace.vertex_indices.size();

        while (remainingFace.vertex_indices.size() > 3 &&
               remainingIterations > 0) {
          npolys = remainingFace.vertex_indices.size();
          if (guess_vert >= npolys) {
            guess_vert -= npolys;
          }

          if (previousRemainingVertices != npolys) {
            // The number of remaining vertices decreased. Reset counters.
            previousRemainingVertices = npolys;
            remainingIterations = npolys;
          } else {
            // We didn't consume a vertex on previous iteration, reduce the
            // available iterations.
            remainingIterations--;
          }

          for (size_t k = 0; k < 3; k++) {
            ind[k] = remainingFace.vertex_indices[(guess_vert + k) % npolys];
            size_t vi = size_t(ind[k].v_idx);
            if (((vi * 3 + axes[0]) >= v.size()) ||
                ((vi * 3 + axes[1]) >= v.size())) {
              // ???
              vx[k] = static_cast<real_t>(0.0);
              vy[k] = static_cast<real_t>(0.0);
            } else {
              vx[k] = v[vi * 3 + axes[0]];
              vy[k] = v[vi * 3 + axes[1]];
            }
          }
          real_t e0x = vx[1] - vx[0];
          real_t e0y = vy[1] - vy[0];
          real_t e1x = vx[2] - vx[1];
          real_t e1y = vy[2] - vy[1];
          real_t cross = e0x * e1y - e0y * e1x;
          // if an internal angle
          if (cross * area < static_cast<real_t>(0.0)) {
            guess_vert += 1;
            continue;
          }

          // check all other verts in case they are inside this triangle
          bool overlap = false;
          for (size_t otherVert = 3; otherVert < npolys; ++otherVert) {
            size_t idx = (guess_vert + otherVert) % npolys;

            if (idx >= remainingFace.vertex_indices.size()) {
              // ???
              continue;
            }

            size_t ovi = size_t(remainingFace.vertex_indices[idx].v_idx);

            if (((ovi * 3 + axes[0]) >= v.size()) ||
                ((ovi * 3 + axes[1]) >= v.size())) {
              // ???
              continue;
            }
            real_t tx = v[ovi * 3 + axes[0]];
            real_t ty = v[ovi * 3 + axes[1]];
            if (pnpoly(3, vx, vy, tx, ty)) {
              overlap = true;
              break;
            }
          }

          if (overlap) {
            guess_vert += 1;
            continue;
          }

          // this triangle is an ear
          {
            index_t idx0, idx1, idx2;
            idx0.vertex_index = ind[0].v_idx;
            idx0.normal_index = ind[0].vn_idx;
            idx0.texcoord_index = ind[0].vt_idx;
            idx1.vertex_index = ind[1].v_idx;
            idx1.normal_index = ind[1].vn_idx;
            idx1.texcoord_index = ind[1].vt_idx;
            idx2.vertex_index = ind[2].v_idx;
            idx2.normal_index = ind[2].vn_idx;
            idx2.texcoord_index = ind[2].vt_idx;

            shape->mesh.indices.push_back(idx0);
            shape->mesh.indices.push_back(idx1);
            shape->mesh.indices.push_back(idx2);

            shape->mesh.num_face_vertices.push_back(3);
            shape->mesh.material_ids.push_back(material_id);
            shape->mesh.smoothing_group_ids.push_back(face.smoothing_group_id);
          }

          // remove v1 from the list
          size_t removed_vert_index = (guess_vert + 1) % npolys;
          while (removed_vert_index + 1 < npolys) {
            remainingFace.vertex_indices[removed_vert_index] =
                remainingFace.vertex_indices[removed_vert_index + 1];
            removed_vert_index += 1;
          }
          remainingFace.vertex_indices.pop_back();
        }

        if (remainingFace.vertex_indices.size() == 3) {
          i0 = remainingFace.vertex_indices[0];
          i1 = remainingFace.vertex_indices[1];
          i2 = remainingFace.vertex_indices[2];
          {
            index_t idx0, idx1, idx2;
            idx0.vertex_index = i0.v_idx;
            idx0.normal_index = i0.vn_idx;
            idx0.texcoord_index = i0.vt_idx;
            idx1.vertex_index = i1.v_idx;
            idx1.normal_index = i1.vn_idx;
            idx1.texcoord_index = i1.vt_idx;
            idx2.vertex_index = i2.v_idx;
            idx2.normal_index = i2.vn_idx;
            idx2.texcoord_index = i2.vt_idx;

            shape->mesh.indices.push_back(idx0);
            shape->mesh.indices.push_back(idx1);
            shape->mesh.indices.push_back(idx2);

            shape->mesh.num_face_vertices.push_back(3);
            shape->mesh.material_ids.push_back(material_id);
            shape->mesh.smoothing_group_ids.push_back(face.smoothing_group_id);
          }
        }
      } else {
        for (size_t k = 0; k < npolys; k++) {
          index_t idx;
          idx.vertex_index = face.vertex_indices[k].v_idx;
          idx.normal_index = face.vertex_indices[k].vn_idx;
          idx.texcoord_index = face.vertex_indices[k].vt_idx;
          shape->mesh.indices.push_back(idx);
        }

        shape->mesh.num_face_vertices.push_back(
            static_cast<unsigned char>(npolys));
        shape->mesh.material_ids.push_back(material_id);  // per face
        shape->mesh.smoothing_group_ids.push_back(
            face.smoothing_group_id);  // per face
      }
    }

    shape->mesh.tags = tags;
  }

  // line
  if (!prim_group.lineGroup.empty()) {
    // Flatten indices
    for (size_t i = 0; i < prim_group.lineGroup.size(); i++) {
      for (size_t j = 0; j < prim_group.lineGroup[i].vertex_indices.size();
           j++) {
        const vertex_index_t &vi = prim_group.lineGroup[i].vertex_indices[j];

        index_t idx;
        idx.vertex_index = vi.v_idx;
        idx.normal_index = vi.vn_idx;
        idx.texcoord_index = vi.vt_idx;

        shape->lines.indices.push_back(idx);
      }

      shape->lines.num_line_vertices.push_back(
          int(prim_group.lineGroup[i].vertex_indices.size()));
    }
  }

  // points
  if (!prim_group.pointsGroup.empty()) {
    // Flatten & convert indices
    for (size_t i = 0; i < prim_group.pointsGroup.size(); i++) {
      for (size_t j = 0; j < prim_group.pointsGroup[i].vertex_indices.size();
           j++) {
        const vertex_index_t &vi = prim_group.pointsGroup[i].vertex_indices[j];

        index_t idx;
        idx.vertex_index = vi.v_idx;
        idx.normal_index = vi.vn_idx;
        idx.texcoord_index = vi.vt_idx;

        shape->points.indices.push_back(idx);
      }
    }
  }

  return true;
}